

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_taylor.cpp
# Opt level: O2

int taylor_check<double,2,2>(char *label,taylor<double,_2,_2> *t,num_t *correct,num_t thres)

{
  double *pdVar1;
  ostream *poVar2;
  undefined8 extraout_RAX;
  int i;
  long lVar3;
  double dVar4;
  ostringstream errmsg;
  ostringstream message;
  allocator local_3e6;
  allocator local_3e5;
  allocator local_3e4;
  allocator local_3e3;
  allocator local_3e2;
  allocator local_3e1;
  num_t local_3e0;
  string local_3d8;
  string local_3b8 [32];
  string local_398 [32];
  string local_378 [32];
  string local_358 [32];
  allocator local_338 [32];
  string local_318 [376];
  ostringstream local_1a0 [376];
  
  lVar3 = 0;
  local_3e0 = thres;
  while( true ) {
    if (lVar3 == 6) {
      return 0;
    }
    i = (int)lVar3;
    pdVar1 = taylor<double,_2,_2>::operator[](t,i);
    dVar4 = ABS(*pdVar1 - correct[lVar3]);
    if (local_3e0 < (dVar4 + dVar4) / (ABS(correct[lVar3]) + 1.0)) break;
    lVar3 = lVar3 + 1;
  }
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  std::__cxx11::string::string(local_318,"Error in coefficient ",local_338);
  poVar2 = std::operator<<((ostream *)local_1a0,local_318);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,i);
  std::__cxx11::string::string((string *)&local_3d8," of ",&local_3e2);
  poVar2 = std::operator<<(poVar2,(string *)&local_3d8);
  std::__cxx11::string::string(local_358,label,&local_3e3);
  poVar2 = std::operator<<(poVar2,local_358);
  std::__cxx11::string::string(local_378,". Correct:",&local_3e4);
  std::operator<<(poVar2,local_378);
  poVar2 = std::ostream::_M_insert<double>(correct[lVar3]);
  std::__cxx11::string::string(local_398,", taylor:",&local_3e5);
  std::operator<<(poVar2,local_398);
  pdVar1 = taylor<double,_2,_2>::operator[](t,i);
  poVar2 = std::ostream::_M_insert<double>(*pdVar1);
  std::__cxx11::string::string(local_3b8," error: ",&local_3e6);
  std::operator<<(poVar2,local_3b8);
  local_3e0 = correct[lVar3];
  pdVar1 = taylor<double,_2,_2>::operator[](t,i);
  std::ostream::_M_insert<double>(local_3e0 - *pdVar1);
  std::__cxx11::string::~string(local_3b8);
  std::__cxx11::string::~string(local_398);
  std::__cxx11::string::~string(local_378);
  std::__cxx11::string::~string(local_358);
  std::__cxx11::string::~string((string *)&local_3d8);
  std::__cxx11::string::~string(local_318);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_318);
  std::__cxx11::string::string((string *)&local_3d8,"Taylor fatal error.\n",&local_3e2);
  poVar2 = std::operator<<((ostream *)local_318,(string *)&local_3d8);
  std::__cxx11::string::string(local_358," In function ",&local_3e3);
  poVar2 = std::operator<<(poVar2,local_358);
  std::__cxx11::string::string(local_378,"taylor_check",&local_3e4);
  poVar2 = std::operator<<(poVar2,local_378);
  std::__cxx11::string::string(local_398," at line ",&local_3e5);
  poVar2 = std::operator<<(poVar2,local_398);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x87);
  std::__cxx11::string::string(local_3b8," of file ",&local_3e6);
  poVar2 = std::operator<<(poVar2,local_3b8);
  std::__cxx11::string::string
            ((string *)local_338,
             "/workspace/llm4binary/github/license_all_cmakelists_25/uekstrom[P]libtaylor/tests/unittest_taylor.cpp"
             ,&local_3e1);
  poVar2 = std::operator<<(poVar2,(string *)local_338);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string((string *)local_338);
  std::__cxx11::string::~string(local_3b8);
  std::__cxx11::string::~string(local_398);
  std::__cxx11::string::~string(local_378);
  std::__cxx11::string::~string(local_358);
  std::__cxx11::string::~string((string *)&local_3d8);
  std::__cxx11::stringbuf::str();
  message_and_die(&local_3d8,(ostringstream *)local_1a0);
  std::__cxx11::string::~string((string *)&local_3d8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_318);
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

int taylor_check(const char * label,
                 const taylor<T, Nvar, Ndeg> & t,
                 const num_t correct[],
                 num_t thres) {
  int nfail = 0;
  for (int i = 0; i < NR_COEFF_CHECK; i++) {
    T err = 2 * std::abs(t[i] - correct[i]) / (1 + std::abs(correct[i]));
    if (err > thres) {
      std::ostringstream message;
      message << std::string("Error in coefficient ") << i << std::string(" of ")
              << std::string(label) << std::string(". Correct:") << correct[i]
              << std::string(", taylor:") << t[i] << std::string(" error: ")
              << correct[i] - t[i];
      TAYLOR_ERROR(message);
      nfail++;
    }
  }
  return nfail;
}